

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraint_Loop.cc
# Opt level: O1

void __thiscall
RigidBodyDynamics::LoopConstraint::calcGamma
          (LoopConstraint *this,Model *model,double time,VectorNd *Q,VectorNd *QDot,MatrixNd *GSys,
          VectorNd *gammaSysUpd,ConstraintCache *cache,bool updateKinematics)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  ulong uVar13;
  long lVar14;
  double dVar15;
  double dVar16;
  Matrix3d local_88;
  Matrix3d *local_40;
  pointer local_38;
  
  CalcBodyToBaseCoordinates
            ((Vector3d *)&local_88,model,Q,
             *(this->super_Constraint).bodyIds.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start,
             &((this->super_Constraint).bodyFrames.
               super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               .
               super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               ._M_impl.super__Vector_impl_data._M_start)->r,updateKinematics);
  *(double *)(cache + 0x4c8) =
       local_88.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[2];
  *(double *)(cache + 0x4b8) =
       local_88.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[0];
  *(double *)(cache + 0x4c0) =
       local_88.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[1];
  CalcBodyWorldOrientation
            (&local_88,model,Q,
             *(this->super_Constraint).bodyIds.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start,updateKinematics);
  local_38 = (this->super_Constraint).bodyFrames.
             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             .
             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_40 = &local_88;
  Matrix3_t::operator=
            ((Matrix3_t *)(cache + 0x470),
             (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
              *)&local_40);
  CalcPointVelocity6D((SpatialVector *)&local_88,model,Q,QDot,
                      *(this->super_Constraint).bodyIds.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start,
                      &((this->super_Constraint).bodyFrames.
                        super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                        .
                        super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                        ._M_impl.super__Vector_impl_data._M_start)->r,updateKinematics);
  *(double *)(cache + 0x370) =
       local_88.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[4];
  *(double *)(cache + 0x378) =
       local_88.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[5];
  *(double *)(cache + 0x360) =
       local_88.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[2];
  *(double *)(cache + 0x368) =
       local_88.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[3];
  *(double *)(cache + 0x350) =
       local_88.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[0];
  *(double *)(cache + 0x358) =
       local_88.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[1];
  CalcPointVelocity6D((SpatialVector *)&local_88,model,Q,QDot,
                      (this->super_Constraint).bodyIds.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[1],
                      &(this->super_Constraint).bodyFrames.
                       super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       .
                       super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                       ._M_impl.super__Vector_impl_data._M_start[1].r,updateKinematics);
  *(double *)(cache + 0x3a0) =
       local_88.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[4];
  *(double *)(cache + 0x3a8) =
       local_88.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[5];
  *(double *)(cache + 0x390) =
       local_88.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[2];
  *(double *)(cache + 0x398) =
       local_88.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[3];
  *(double *)(cache + 0x380) =
       local_88.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[0];
  *(double *)(cache + 0x388) =
       local_88.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[1];
  CalcPointAcceleration6D
            ((SpatialVector *)&local_88,model,Q,QDot,(VectorNd *)cache,
             *(this->super_Constraint).bodyIds.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start,
             &((this->super_Constraint).bodyFrames.
               super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               .
               super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               ._M_impl.super__Vector_impl_data._M_start)->r,updateKinematics);
  *(double *)(cache + 0x3d0) =
       local_88.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[4];
  *(double *)(cache + 0x3d8) =
       local_88.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[5];
  *(double *)(cache + 0x3c0) =
       local_88.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[2];
  *(double *)(cache + 0x3c8) =
       local_88.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[3];
  *(double *)(cache + 0x3b0) =
       local_88.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[0];
  *(double *)(cache + 0x3b8) =
       local_88.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[1];
  CalcPointAcceleration6D
            ((SpatialVector *)&local_88,model,Q,QDot,(VectorNd *)cache,
             (this->super_Constraint).bodyIds.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[1],
             &(this->super_Constraint).bodyFrames.
              super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
              .
              super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
              ._M_impl.super__Vector_impl_data._M_start[1].r,updateKinematics);
  *(double *)(cache + 0x400) =
       local_88.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[4];
  *(double *)(cache + 0x408) =
       local_88.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[5];
  *(double *)(cache + 0x3f0) =
       local_88.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[2];
  *(double *)(cache + 0x3f8) =
       local_88.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[3];
  *(double *)(cache + 0x3e0) =
       local_88.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[0];
  *(double *)(cache + 1000) =
       local_88.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[1];
  if ((this->super_Constraint).sizeOfConstraint != 0) {
    lVar14 = 0;
    uVar13 = 0;
    do {
      Math::SpatialTransform::apply
                ((SpatialTransform *)(cache + 0x470),
                 (SpatialVector *)(*(long *)&(this->super_Constraint).field_0xd8 + lVar14));
      *(double *)(cache + 0x430) =
           local_88.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
           m_storage.m_data.array[4];
      *(double *)(cache + 0x438) =
           local_88.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
           m_storage.m_data.array[5];
      *(double *)(cache + 0x420) =
           local_88.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
           m_storage.m_data.array[2];
      *(double *)(cache + 0x428) =
           local_88.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
           m_storage.m_data.array[3];
      *(double *)(cache + 0x410) =
           local_88.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
           m_storage.m_data.array[0];
      *(double *)(cache + 0x418) =
           local_88.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
           m_storage.m_data.array[1];
      dVar16 = *(double *)(cache + 0x360);
      dVar1 = *(double *)(cache + 0x420);
      dVar15 = *(double *)(cache + 0x350);
      dVar2 = *(double *)(cache + 0x358);
      dVar9 = *(double *)(cache + 0x410);
      dVar10 = *(double *)(cache + 0x418);
      dVar7 = -dVar16 * dVar10 + dVar1 * dVar2;
      dVar8 = dVar16 * dVar9 + -dVar15 * dVar1;
      auVar6._8_4_ = SUB84(dVar8,0);
      auVar6._0_8_ = dVar7;
      auVar6._12_4_ = (int)((ulong)dVar8 >> 0x20);
      *(undefined1 (*) [16])(cache + 0x440) = auVar6;
      dVar11 = *(double *)(cache + 0x430);
      dVar12 = *(double *)(cache + 0x438);
      dVar4 = -dVar15 * dVar12 +
              *(double *)(cache + 0x428) * dVar16 +
              dVar9 * *(double *)(cache + 0x378) + -*(double *)(cache + 0x368) * dVar1;
      dVar5 = dVar15 * dVar11 +
              *(double *)(cache + 0x428) * -dVar2 +
              dVar9 * -*(double *)(cache + 0x370) + dVar10 * *(double *)(cache + 0x368);
      dVar15 = dVar9 * -dVar2 + dVar10 * dVar15;
      dVar16 = dVar12 * dVar2 +
               ((dVar1 * *(double *)(cache + 0x370) - *(double *)(cache + 0x378) * dVar10) -
               dVar16 * dVar11);
      *(double *)(cache + 0x450) = dVar15;
      *(double *)(cache + 0x458) = dVar16;
      auVar3._8_4_ = SUB84(dVar5,0);
      auVar3._0_8_ = dVar4;
      auVar3._12_4_ = (int)((ulong)dVar5 >> 0x20);
      *(undefined1 (*) [16])(cache + 0x460) = auVar3;
      (gammaSysUpd->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      [(this->super_Constraint).rowInSystem + (int)uVar13] =
           -((*(double *)(cache + 0x408) - *(double *)(cache + 0x3d8)) * dVar12 +
             (*(double *)(cache + 0x3f8) - *(double *)(cache + 0x3c8)) * *(double *)(cache + 0x428)
             + (*(double *)(cache + 1000) - *(double *)(cache + 0x3b8)) * dVar10 +
            (*(double *)(cache + 0x400) - *(double *)(cache + 0x3d0)) * dVar11 +
            (*(double *)(cache + 0x3f0) - *(double *)(cache + 0x3c0)) * *(double *)(cache + 0x420) +
            (*(double *)(cache + 0x3e0) - *(double *)(cache + 0x3b0)) * dVar9) -
           ((*(double *)(cache + 0x3a8) - *(double *)(cache + 0x378)) * dVar5 +
            (*(double *)(cache + 0x398) - *(double *)(cache + 0x368)) * dVar16 +
            (*(double *)(cache + 0x388) - *(double *)(cache + 0x358)) * dVar8 +
           (*(double *)(cache + 0x3a0) - *(double *)(cache + 0x370)) * dVar4 +
           (*(double *)(cache + 0x390) - *(double *)(cache + 0x360)) * dVar15 +
           (*(double *)(cache + 0x380) - *(double *)(cache + 0x350)) * dVar7);
      uVar13 = uVar13 + 1;
      lVar14 = lVar14 + 0x30;
    } while (uVar13 < (this->super_Constraint).sizeOfConstraint);
  }
  return;
}

Assistant:

void LoopConstraint::calcGamma(  Model &model,
                  const double time,
                  const Math::VectorNd &Q,
                  const Math::VectorNd &QDot,
                  const Math::MatrixNd &GSys,
                  Math::VectorNd &gammaSysUpd,
                  ConstraintCache &cache,
                  bool updateKinematics)
{
  //Please refer to Ch. 8 of Featherstone's Rigid Body Dynamics text for details

  // Express the constraint axis in the base frame.
  cache.stA.r = CalcBodyToBaseCoordinates(model,Q,bodyIds[0],bodyFrames[0].r,
                                          updateKinematics);
  cache.stA.E = CalcBodyWorldOrientation(model,Q,bodyIds[0],updateKinematics
                                         ).transpose()*bodyFrames[0].E;

  // Compute the spatial velocities of the two constrained bodies.
  //vel_p
  cache.svecA = CalcPointVelocity6D(model,Q,QDot,bodyIds[0],bodyFrames[0].r,
                                    updateKinematics);

  //vel_s
  cache.svecB = CalcPointVelocity6D(model,Q,QDot,bodyIds[1],bodyFrames[1].r,
                                    updateKinematics);

  // Compute the velocity product accelerations. These correspond to the
  // accelerations that the bodies would have if q ddot were 0. If this
  // confuses you please see Sec. 8.2 of Featherstone's Rigid Body Dynamics text

  //acc_p
  cache.svecC = CalcPointAcceleration6D(model,Q,QDot,cache.vecNZeros,
                                        bodyIds[0],bodyFrames[0].r,updateKinematics);
  //acc_s
  cache.svecD = CalcPointAcceleration6D(model,Q,QDot,cache.vecNZeros,
                                        bodyIds[1],bodyFrames[1].r,updateKinematics);

  for(unsigned int i=0; i<sizeOfConstraint;++i){

    cache.svecE = cache.stA.apply(T[i]);

    cache.svecF = crossm(cache.svecA, cache.svecE);

    gammaSysUpd[rowInSystem+i] =
        -cache.svecE.dot(cache.svecD-cache.svecC)
        -cache.svecF.dot(cache.svecB-cache.svecA);
  }

}